

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::~Codec(Codec *this)

{
  if (this->_recovery_blocks != (uint8_t *)0x0) {
    SIMDSafeFree(this->_recovery_blocks);
    this->_recovery_blocks = (uint8_t *)0x0;
  }
  this->_workspace_allocated = 0;
  if (this->_compress_matrix != (uint64_t *)0x0) {
    SIMDSafeFree(this->_compress_matrix);
    this->_compress_matrix = (uint64_t *)0x0;
  }
  this->_ge_allocated = 0;
  if ((this->_input_allocated != 0) && (this->_input_blocks != (uint8_t *)0x0)) {
    SIMDSafeFree(this->_input_blocks);
    this->_input_blocks = (uint8_t *)0x0;
  }
  this->_input_allocated = 0;
  return;
}

Assistant:

Codec::~Codec()
{
    FreeWorkspace();
    FreeMatrix();
    FreeInput();
}